

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O3

void __thiscall kratos::SequentialStmtBlock::~SequentialStmtBlock(SequentialStmtBlock *this)

{
  pointer pEVar1;
  
  (this->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002afc10;
  pEVar1 = (this->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1,(long)(this->conditions_).
                                 super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar1);
  }
  (this->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002af620;
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector(&(this->super_StmtBlock).stmts_);
  Stmt::~Stmt((Stmt *)this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

SequentialStmtBlock() : StmtBlock(StatementBlockType::Sequential) {}